

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O3

void Abc_SclManFree(SC_Man *p)

{
  uint uVar1;
  int iVar2;
  Vec_Que_t *pVVar3;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  float *pfVar4;
  long lVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  Vec_Int_t *pVVar12;
  Vec_Flt_t *pVVar13;
  int iVar14;
  ulong uVar15;
  Abc_Ntk_t *pAVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  
  pAVar16 = p->pNtk;
  pVVar7 = pAVar16->vCis;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pVVar7->pArray[lVar5] + 0x38) = 0;
      lVar5 = lVar5 + 1;
      pAVar16 = p->pNtk;
      pVVar7 = pAVar16->vCis;
    } while (lVar5 < pVVar7->nSize);
  }
  pVVar7 = pAVar16->vCos;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pVVar7->pArray[lVar5] + 0x38) = 0;
      lVar5 = lVar5 + 1;
      pAVar16 = p->pNtk;
      pVVar7 = pAVar16->vCos;
    } while (lVar5 < pVVar7->nSize);
  }
  pAVar16->pSCLib = (void *)0x0;
  pVVar12 = pAVar16->vGates;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      pAVar16->vGates->pArray = (int *)0x0;
      pVVar12 = pAVar16->vGates;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_00472ac8;
    }
    free(pVVar12);
    pAVar16->vGates = (Vec_Int_t *)0x0;
  }
LAB_00472ac8:
  pVVar12 = p->vNodeIter;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vNodeIter->pArray = (int *)0x0;
      pVVar12 = p->vNodeIter;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_00472b10;
    }
    free(pVVar12);
    p->vNodeIter = (Vec_Int_t *)0x0;
  }
LAB_00472b10:
  pVVar3 = p->vNodeByGain;
  if (pVVar3 != (Vec_Que_t *)0x0) {
    if (pVVar3->pOrder != (int *)0x0) {
      free(pVVar3->pOrder);
      pVVar3->pOrder = (int *)0x0;
    }
    if (pVVar3->pHeap != (int *)0x0) {
      free(pVVar3->pHeap);
    }
    free(pVVar3);
  }
  p->vNodeByGain = (Vec_Que_t *)0x0;
  pVVar13 = p->vNode2Gain;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vNode2Gain->pArray = (float *)0x0;
      pVVar13 = p->vNode2Gain;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_00472b9b;
    }
    free(pVVar13);
    p->vNode2Gain = (Vec_Flt_t *)0x0;
  }
LAB_00472b9b:
  pVVar12 = p->vNode2Gate;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vNode2Gate->pArray = (int *)0x0;
      pVVar12 = p->vNode2Gate;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_00472be3;
    }
    free(pVVar12);
    p->vNode2Gate = (Vec_Int_t *)0x0;
  }
LAB_00472be3:
  pVVar13 = p->vLoads2;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vLoads2->pArray = (float *)0x0;
      pVVar13 = p->vLoads2;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_00472c2b;
    }
    free(pVVar13);
    p->vLoads2 = (Vec_Flt_t *)0x0;
  }
LAB_00472c2b:
  pVVar13 = p->vLoads3;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vLoads3->pArray = (float *)0x0;
      pVVar13 = p->vLoads3;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_00472c73;
    }
    free(pVVar13);
    p->vLoads3 = (Vec_Flt_t *)0x0;
  }
LAB_00472c73:
  pVVar13 = p->vTimes2;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vTimes2->pArray = (float *)0x0;
      pVVar13 = p->vTimes2;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_00472cbb;
    }
    free(pVVar13);
    p->vTimes2 = (Vec_Flt_t *)0x0;
  }
LAB_00472cbb:
  pVVar13 = p->vTimes3;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vTimes3->pArray = (float *)0x0;
      pVVar13 = p->vTimes3;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_00472d03;
    }
    free(pVVar13);
    p->vTimes3 = (Vec_Flt_t *)0x0;
  }
LAB_00472d03:
  pVVar12 = p->vUpdates;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vUpdates->pArray = (int *)0x0;
      pVVar12 = p->vUpdates;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_00472d3f;
    }
    free(pVVar12);
    p->vUpdates = (Vec_Int_t *)0x0;
  }
LAB_00472d3f:
  pVVar12 = p->vUpdates2;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vUpdates2->pArray = (int *)0x0;
      pVVar12 = p->vUpdates2;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_00472d7b;
    }
    free(pVVar12);
    p->vUpdates2 = (Vec_Int_t *)0x0;
  }
LAB_00472d7b:
  pVVar12 = p->vGatesBest;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vGatesBest->pArray = (int *)0x0;
      pVVar12 = p->vGatesBest;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_00472db7;
    }
    free(pVVar12);
    p->vGatesBest = (Vec_Int_t *)0x0;
  }
LAB_00472db7:
  __ptr = p->vLevels;
  if (__ptr != (Vec_Wec_t *)0x0) {
    iVar6 = __ptr->nCap;
    pVVar12 = __ptr->pArray;
    if (iVar6 < 1) {
      if (pVVar12 != (Vec_Int_t *)0x0) goto LAB_00472e0d;
    }
    else {
      lVar17 = 8;
      lVar5 = 0;
      do {
        __ptr_00 = *(void **)((long)&pVVar12->nCap + lVar17);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          pVVar12 = __ptr->pArray;
          *(undefined8 *)((long)&pVVar12->nCap + lVar17) = 0;
          iVar6 = __ptr->nCap;
        }
        lVar5 = lVar5 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar5 < iVar6);
LAB_00472e0d:
      free(pVVar12);
    }
    free(__ptr);
    p->vLevels = (Vec_Wec_t *)0x0;
  }
  pVVar12 = p->vChanged;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vChanged->pArray = (int *)0x0;
      pVVar12 = p->vChanged;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_00472e6d;
    }
    free(pVVar12);
    p->vChanged = (Vec_Int_t *)0x0;
  }
LAB_00472e6d:
  pVVar3 = p->vQue;
  iVar6 = pVVar3->nSize;
  if (iVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x124,"void Vec_QueCheck(Vec_Que_t *)");
  }
  iVar8 = pVVar3->nCap;
  if (iVar8 < iVar6) {
    __assert_fail("p->nSize <= p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x125,"void Vec_QueCheck(Vec_Que_t *)");
  }
  uVar1 = iVar6 - 1;
  uVar15 = 0;
  if (iVar6 != 1) {
    uVar15 = 0;
    do {
      if (pVVar3->pOrder[uVar15] < 1) {
        __assert_fail("p->pOrder[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x128,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar15 = uVar15 + 1;
    } while (uVar1 != uVar15);
    uVar15 = (ulong)uVar1;
  }
  if ((int)uVar15 < iVar8) {
    piVar11 = pVVar3->pOrder + uVar15;
    do {
      if (*piVar11 != -1) {
        __assert_fail("p->pOrder[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x12a,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar10 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar10;
      piVar11 = piVar11 + 1;
    } while ((int)uVar10 < iVar8);
  }
  piVar11 = pVVar3->pHeap;
  if (*piVar11 != -1) {
    __assert_fail("p->pHeap[0] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,300,"void Vec_QueCheck(Vec_Que_t *)");
  }
  if (iVar6 == 1) {
    uVar15 = 0;
  }
  else {
    uVar15 = 1;
    if (1 < (int)uVar1) {
      uVar15 = (ulong)uVar1;
    }
    uVar9 = 0;
    do {
      if (uVar9 != (uint)piVar11[pVVar3->pOrder[uVar9]]) {
        __assert_fail("p->pHeap[p->pOrder[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x12e,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
  }
  while (uVar15 = uVar15 + 1, (long)uVar15 < (long)iVar8) {
    if (piVar11[uVar15] != -1) {
      __assert_fail("p->pHeap[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x130,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  if (iVar6 != 1) {
    iVar8 = 2;
    if (2 < iVar6) {
      iVar8 = iVar6;
    }
    uVar15 = 2;
    iVar14 = 3;
    lVar5 = 0x200000000;
    do {
      if ((int)uVar15 < iVar6) {
        iVar2 = *(int *)((long)piVar11 + uVar15 * 2);
        pfVar4 = *pVVar3->pCostsFlt;
        if (pfVar4 == (float *)0x0) {
          fVar18 = (float)iVar2;
          fVar19 = (float)*(int *)((long)piVar11 + (lVar5 >> 0x1e));
        }
        else {
          fVar18 = pfVar4[iVar2];
          fVar19 = pfVar4[*(int *)((long)piVar11 + (lVar5 >> 0x1e))];
        }
        if (fVar18 < fVar19) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0x136,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      if (iVar14 < iVar6) {
        iVar2 = *(int *)((long)piVar11 + uVar15 * 2);
        pfVar4 = *pVVar3->pCostsFlt;
        if (pfVar4 == (float *)0x0) {
          fVar18 = (float)iVar2;
          fVar19 = (float)piVar11[iVar14];
        }
        else {
          fVar18 = pfVar4[iVar2];
          fVar19 = pfVar4[piVar11[iVar14]];
        }
        if (fVar18 < fVar19) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0x139,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      uVar15 = uVar15 + 2;
      iVar14 = iVar14 + 2;
      lVar5 = lVar5 + 0x200000000;
    } while ((uint)(iVar8 * 2) != uVar15);
  }
  if (pVVar3->pOrder != (int *)0x0) {
    free(pVVar3->pOrder);
    pVVar3->pOrder = (int *)0x0;
    piVar11 = pVVar3->pHeap;
  }
  if (piVar11 != (int *)0x0) {
    free(piVar11);
  }
  free(pVVar3);
  p->vQue = (Vec_Que_t *)0x0;
  pVVar13 = p->vTimesOut;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vTimesOut->pArray = (float *)0x0;
      pVVar13 = p->vTimesOut;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_0047308c;
    }
    free(pVVar13);
    p->vTimesOut = (Vec_Flt_t *)0x0;
  }
LAB_0047308c:
  pVVar12 = p->vBestFans;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      p->vBestFans->pArray = (int *)0x0;
      pVVar12 = p->vBestFans;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_004730d4;
    }
    free(pVVar12);
    p->vBestFans = (Vec_Int_t *)0x0;
  }
LAB_004730d4:
  pVVar13 = p->vInDrive;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vInDrive->pArray = (float *)0x0;
      pVVar13 = p->vInDrive;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_00473110;
    }
    free(pVVar13);
    p->vInDrive = (Vec_Flt_t *)0x0;
  }
LAB_00473110:
  pVVar13 = p->vWireCaps;
  if (pVVar13 != (Vec_Flt_t *)0x0) {
    if (pVVar13->pArray != (float *)0x0) {
      free(pVVar13->pArray);
      p->vWireCaps->pArray = (float *)0x0;
      pVVar13 = p->vWireCaps;
      if (pVVar13 == (Vec_Flt_t *)0x0) goto LAB_0047314c;
    }
    free(pVVar13);
    p->vWireCaps = (Vec_Flt_t *)0x0;
  }
LAB_0047314c:
  if (p->pLoads != (SC_Pair *)0x0) {
    free(p->pLoads);
    p->pLoads = (SC_Pair *)0x0;
  }
  if (p->pDepts != (SC_Pair *)0x0) {
    free(p->pDepts);
    p->pDepts = (SC_Pair *)0x0;
  }
  if (p->pTimes != (SC_Pair *)0x0) {
    free(p->pTimes);
    p->pTimes = (SC_Pair *)0x0;
  }
  if (p->pSlews != (SC_Pair *)0x0) {
    free(p->pSlews);
  }
  free(p);
  return;
}

Assistant:

static inline void Abc_SclManFree( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i;
    // set CI/CO ids
    Abc_NtkForEachCi( p->pNtk, pObj, i )
        pObj->iData = 0;
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        pObj->iData = 0;
    // other
    p->pNtk->pSCLib = NULL;
    Vec_IntFreeP( &p->pNtk->vGates );
    Vec_IntFreeP( &p->vNodeIter );
    Vec_QueFreeP( &p->vNodeByGain );
    Vec_FltFreeP( &p->vNode2Gain );
    Vec_IntFreeP( &p->vNode2Gate );
    // intermediate data
    Vec_FltFreeP( &p->vLoads2 );
    Vec_FltFreeP( &p->vLoads3 );
    Vec_FltFreeP( &p->vTimes2 );
    Vec_FltFreeP( &p->vTimes3 );
    Vec_IntFreeP( &p->vUpdates );
    Vec_IntFreeP( &p->vUpdates2 );
    Vec_IntFreeP( &p->vGatesBest );
    Vec_WecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vChanged );
//    Vec_QuePrint( p->vQue );
    Vec_QueCheck( p->vQue );
    Vec_QueFreeP( &p->vQue );
    Vec_FltFreeP( &p->vTimesOut );
    Vec_IntFreeP( &p->vBestFans );
    Vec_FltFreeP( &p->vInDrive );
    Vec_FltFreeP( &p->vWireCaps );
    ABC_FREE( p->pLoads );
    ABC_FREE( p->pDepts );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pSlews );
    ABC_FREE( p );
}